

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O2

SPxId __thiscall soplex::SPxParMultPR<double>::selectEnter(SPxParMultPR<double> *this)

{
  DataKey *pDVar1;
  pointer pSVar2;
  DataKey DVar3;
  ulong uVar4;
  int iVar5;
  pointer pSVar6;
  long lVar7;
  DataKey DVar8;
  SPxId SVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  double *pdVar13;
  ulong uVar14;
  SPxSolverBase<double> *pSVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  double local_48;
  
  pSVar15 = (this->super_SPxPricer<double>).thesolver;
  uVar18 = 0xffffffff00000000;
  local_48 = -(this->super_SPxPricer<double>).thetolerance;
  if (pSVar15->thePricing == PARTIAL) {
    uVar14 = (ulong)(uint)this->used;
    iVar12 = this->last;
    lVar17 = uVar14 << 4;
    while( true ) {
      if ((int)uVar14 < 1) break;
      iVar5 = SPxLPBase<double>::number
                        (&((this->super_SPxPricer<double>).thesolver)->super_SPxLPBase<double>,
                         (SPxId *)((long)&(this->pricSet).data.
                                          super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].id.
                                          super_DataKey + lVar17));
      pSVar15 = (this->super_SPxPricer<double>).thesolver;
      pSVar6 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pSVar15->theRep * *(int *)((long)&pSVar6[-1].id.super_DataKey + lVar17) < 1) {
        dVar19 = (pSVar15->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar5];
      }
      else {
        SPxSolverBase<double>::computePvec(pSVar15,iVar5);
        dVar19 = SPxSolverBase<double>::computeTest((this->super_SPxPricer<double>).thesolver,iVar5)
        ;
        pSVar6 = (this->pricSet).data.
                 super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(double *)((long)&pSVar6[-1].test + lVar17) = dVar19;
      if (local_48 <= dVar19) {
        lVar7 = (long)this->used + -1;
        this->used = (int)lVar7;
        pSVar2 = (this->pricSet).data.
                 super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar6 = pSVar2 + lVar7;
        DVar8 = (DataKey)pSVar6->test;
        pDVar1 = (DataKey *)((long)&pSVar2[-1].id.super_DataKey + lVar17);
        *pDVar1 = (pSVar6->id).super_DataKey;
        pDVar1[1] = DVar8;
      }
      uVar14 = (ulong)((int)uVar14 - 1);
      lVar17 = lVar17 + -0x10;
    }
    while( true ) {
      pSVar6 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar5 = this->used;
      if (this->partialSize <=
          (int)((ulong)((long)(this->pricSet).data.
                              super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 4) -
          iVar5) break;
      pdVar13 = &pSVar6[1].test;
      uVar16 = 0;
      for (uVar14 = 1; (long)uVar14 < (long)iVar5; uVar14 = uVar14 + 1) {
        uVar4 = uVar14 & 0xffffffff;
        if (*pdVar13 < pSVar6[(int)uVar16].test || *pdVar13 == pSVar6[(int)uVar16].test) {
          uVar4 = uVar16;
        }
        uVar16 = uVar4;
        pdVar13 = pdVar13 + 2;
      }
      this->used = iVar5 + -1;
      dVar19 = pSVar6[(long)iVar5 + -1].test;
      pSVar6[(int)uVar16].id.super_DataKey = pSVar6[(long)iVar5 + -1].id.super_DataKey;
      pSVar6[(int)uVar16].test = dVar19;
    }
    iVar5 = this->multiParts;
    iVar11 = this->last;
    do {
      uVar10 = (iVar11 + 1) % iVar5;
      this->last = uVar10;
      for (iVar11 = ~uVar10 + (((this->super_SPxPricer<double>).thesolver)->thevectors->set).thenum;
          pSVar15 = (this->super_SPxPricer<double>).thesolver, -1 < iVar11; iVar11 = iVar11 - iVar5)
      {
        SPxSolverBase<double>::computePvec(pSVar15,iVar11);
        dVar19 = SPxSolverBase<double>::computeTest
                           ((this->super_SPxPricer<double>).thesolver,iVar11);
        if (dVar19 < local_48) {
          SVar9 = SPxSolverBase<double>::id((this->super_SPxPricer<double>).thesolver,iVar11);
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
               SVar9.super_DataKey;
          iVar5 = this->used;
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar5].test = dVar19;
          this->used = iVar5 + 1;
        }
        iVar5 = this->multiParts;
      }
      for (uVar10 = ~this->last + (pSVar15->thecovectors->set).thenum; -1 < (int)uVar10;
          uVar10 = uVar10 - iVar5) {
        pSVar15 = (this->super_SPxPricer<double>).thesolver;
        dVar19 = (pSVar15->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar10];
        if (dVar19 < local_48) {
          SVar9 = SPxSolverBase<double>::coId(pSVar15,uVar10);
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
               SVar9.super_DataKey;
          iVar5 = this->used;
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar5].test = dVar19;
          this->used = iVar5 + 1;
          iVar5 = this->multiParts;
        }
      }
      uVar10 = this->used;
    } while (((int)uVar10 < this->min) && (iVar11 = this->last, iVar11 != iVar12));
    DVar8.info = 0;
    DVar8.idx = 0;
    if (0 < (int)uVar10) {
      iVar12 = this->partialSize;
      if ((int)(uVar10 + 1) < this->partialSize) {
        iVar12 = uVar10 + 1;
      }
      this->min = iVar12;
      pSVar6 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar13 = &pSVar6[1].test;
      for (uVar18 = 1; uVar10 != uVar18; uVar18 = uVar18 + 1) {
        DVar3 = (DataKey)(uVar18 & 0xffffffff);
        if (pSVar6[DVar8.info].test < *pdVar13 || pSVar6[DVar8.info].test == *pdVar13) {
          DVar3 = DVar8;
        }
        DVar8 = DVar3;
        pdVar13 = pdVar13 + 2;
      }
      DVar8 = pSVar6[DVar8.info].id.super_DataKey;
      uVar18 = (ulong)DVar8 & 0xffffffff00000000;
    }
  }
  else {
    uVar10 = (pSVar15->thecovectors->set).thenum;
    DVar8.info = 0;
    DVar8.idx = 0;
    uVar18 = 0xffffffff00000000;
    while (0 < (int)uVar10) {
      uVar10 = uVar10 - 1;
      pdVar13 = (pSVar15->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start + uVar10;
      if (*pdVar13 <= local_48 && local_48 != *pdVar13) {
        DVar8 = (DataKey)SPxSolverBase<double>::coId(pSVar15,uVar10);
        uVar18 = (ulong)DVar8 & 0xffffffff00000000;
        pSVar15 = (this->super_SPxPricer<double>).thesolver;
        local_48 = (pSVar15->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10];
      }
    }
    uVar10 = (pSVar15->thevectors->set).thenum;
    while (0 < (int)uVar10) {
      uVar10 = uVar10 - 1;
      pdVar13 = (pSVar15->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + uVar10;
      if (*pdVar13 <= local_48 && local_48 != *pdVar13) {
        DVar8 = (DataKey)SPxSolverBase<double>::id(pSVar15,uVar10);
        uVar18 = (ulong)DVar8 & 0xffffffff00000000;
        pSVar15 = (this->super_SPxPricer<double>).thesolver;
        local_48 = (pSVar15->theTest).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10];
      }
    }
  }
  return (SPxId)((ulong)DVar8 & 0xffffffff | uVar18);
}

Assistant:

SPxId SPxParMultPR<R>::selectEnter()
{
   SPxId id;
   R x;
   int i;
   int best = -1;
   //    const SPxBasisBase<R>::Desc& ds   = this->thesolver->basis().desc();

   assert(this->thesolver != nullptr);
   int lastlast = -1;

   if(this->thesolver->pricing() == SPxSolverBase<R>::PARTIAL)
   {
      R val;
      R tol = -this->thetolerance;
      lastlast = last;

      for(i = used - 1; i >= 0; --i)
      {
         int n = this->thesolver->number(pricSet[i].id);

         if(this->thesolver->isId(pricSet[i].id))
         {
            this->thesolver->computePvec(n);
            pricSet[i].test = val = this->thesolver->computeTest(n);
         }
         else
            pricSet[i].test = val = this->thesolver->coTest()[n];

         if(val >= tol)
            pricSet[i] = pricSet[--used];
      }

      while(pricSet.size() - used < partialSize)
      {
         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test > pricSet[best].test)
               best = i;
         }

         pricSet[best] = pricSet[--used];
      }

      do
      {
         last = (last + 1) % multiParts;

         for(i = this->thesolver->coDim() - last - 1;
               i >= 0; i -= multiParts)
         {
            this->thesolver->computePvec(i);
            x = this->thesolver->computeTest(i);

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->id(i);
               pricSet[used].test = x;
               used++;
            }
         }

         for(i = this->thesolver->dim() - last - 1;
               i >= 0; i -= multiParts)
         {
            x = this->thesolver->coTest()[i];

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->coId(i);
               pricSet[used].test = x;
               used++;
            }
         }

         assert(used < pricSet.size());
      }
      while(used < min && last != lastlast);

      if(used > 0)
      {
         min = (used + 1);

         if(min < 1)
            min = 1;

         if(min > partialSize)
            min = partialSize;

         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test < pricSet[best].test)
               best = i;
         }

         id = pricSet[best].id;
      }

      return id;
   }

   else
   {
      assert(this->thesolver->pricing() == SPxSolverBase<R>::FULL);
      R bestx = -this->thetolerance;

      for(i = this->thesolver->dim() - 1; i >= 0; --i)
      {
         x = this->thesolver->coTest()[i];

         // x *= EQ_PREF * (1 + (ds.coStatus(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.coStatus(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->coId(i);
            bestx = this->thesolver->coTest()[i];
         }
      }

      for(i = this->thesolver->coDim() - 1; i >= 0; --i)
      {
         x = this->thesolver->test()[i];

         // x *= EQ_PREF * (1 + (ds.status(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.status(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->id(i);
            bestx = this->thesolver->test()[i];
         }
      }

      return id;
   }
}